

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

void __thiscall
spv::Function::dump(Function *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  Instruction *this_00;
  pointer ppIVar1;
  long lVar2;
  Instruction end;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  Instruction local_78;
  
  this_00 = (this->lineInstruction)._M_t.
            super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  if (this_00 != (Instruction *)0x0) {
    Instruction::dump(this_00,out);
  }
  Instruction::dump(&this->functionInstruction,out);
  ppIVar1 = (this->parameterInstructions).
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->parameterInstructions).
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3)) {
    lVar2 = 0;
    do {
      Instruction::dump(ppIVar1[lVar2],out);
      lVar2 = lVar2 + 1;
      ppIVar1 = (this->parameterInstructions).
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->parameterInstructions).
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1)
                          >> 3));
  }
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h:458:36)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h:458:36)>
             ::_M_manager;
  local_98._M_unused._M_object = out;
  inReadableOrder(*(this->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                  (function<void_(spv::Block_*,_spv::ReachReason,_spv::Block_*)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  local_78._vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  local_78.resultId = 0;
  local_78.typeId = 0;
  local_78.opCode = OpFunctionEnd;
  local_78.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_78.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_78.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_78.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_78.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_78.block = (Block *)0x0;
  Instruction::dump(&local_78,out);
  Instruction::~Instruction(&local_78);
  return;
}

Assistant:

void dump(std::vector<unsigned int>& out) const
    {
        // OpLine
        if (lineInstruction != nullptr) {
            lineInstruction->dump(out);
        }

        // OpFunction
        functionInstruction.dump(out);

        // OpFunctionParameter
        for (int p = 0; p < (int)parameterInstructions.size(); ++p)
            parameterInstructions[p]->dump(out);

        // Blocks
        inReadableOrder(blocks[0], [&out](const Block* b, ReachReason, Block*) { b->dump(out); });
        Instruction end(0, 0, OpFunctionEnd);
        end.dump(out);
    }